

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool do_clast_general(DisasContext_conflict1 *s,arg_rpr_esz *a,_Bool before)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGv_i64 ret;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    ret = cpu_reg_aarch64(s,a->rd);
    switch(a->esz) {
    case 0:
      tcg_gen_ext8u_i64_aarch64(tcg_ctx,ret,ret);
      break;
    case 1:
      tcg_gen_ext16u_i64_aarch64(tcg_ctx,ret,ret);
      break;
    case 2:
      tcg_gen_ext32u_i64_aarch64(tcg_ctx,ret,ret);
      break;
    case 3:
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-sve.c"
                 ,0xa6b,(char *)0x0);
    }
    do_clast_scalar(s,a->esz,a->pg,a->rn,before,ret);
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool do_clast_general(DisasContext *s, arg_rpr_esz *a, bool before)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 reg;

    if (!sve_access_check(s)) {
        return true;
    }

    reg = cpu_reg(s, a->rd);
    switch (a->esz) {
    case 0:
        tcg_gen_ext8u_i64(tcg_ctx, reg, reg);
        break;
    case 1:
        tcg_gen_ext16u_i64(tcg_ctx, reg, reg);
        break;
    case 2:
        tcg_gen_ext32u_i64(tcg_ctx, reg, reg);
        break;
    case 3:
        break;
    default:
        g_assert_not_reached();
    }

    do_clast_scalar(s, a->esz, a->pg, a->rn, before, reg);
    return true;
}